

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

cram_codec *
cram_byte_array_len_encode_init(cram_stats *st,cram_external_type option,void *dat,int version)

{
  cram_codec *pcVar1;
  cram_byte_array_len_encoder *e;
  cram_codec *c;
  int version_local;
  void *dat_local;
  cram_external_type option_local;
  cram_stats *st_local;
  
  st_local = (cram_stats *)malloc(0x240);
  if (st_local == (cram_stats *)0x0) {
    st_local = (cram_stats *)0x0;
  }
  else {
    st_local->freqs[0] = 4;
    *(code **)(st_local->freqs + 4) = cram_byte_array_len_encode_free;
    *(code **)(st_local->freqs + 8) = cram_byte_array_len_encode;
    *(code **)(st_local->freqs + 10) = cram_byte_array_len_encode_store;
    pcVar1 = cram_encoder_init(*dat,(cram_stats *)0x0,E_INT,*(void **)((long)dat + 8),version);
    *(cram_codec **)(st_local->freqs + 0x12) = pcVar1;
    pcVar1 = cram_encoder_init(*(cram_encoding *)((long)dat + 4),(cram_stats *)0x0,E_BYTE_ARRAY,
                               *(void **)((long)dat + 0x10),version);
    *(cram_codec **)(st_local->freqs + 0x14) = pcVar1;
  }
  return (cram_codec *)st_local;
}

Assistant:

cram_codec *cram_byte_array_len_encode_init(cram_stats *st,
					    enum cram_external_type option,
					    void *dat,
					    int version) {
    cram_codec *c;
    cram_byte_array_len_encoder *e = (cram_byte_array_len_encoder *)dat;

    c = malloc(sizeof(*c));
    if (!c)
	return NULL;
    c->codec = E_BYTE_ARRAY_LEN;
    c->free = cram_byte_array_len_encode_free;
    c->encode = cram_byte_array_len_encode;
    c->store = cram_byte_array_len_encode_store;

    c->e_byte_array_len.len_codec = cram_encoder_init(e->len_encoding,
						      NULL, E_INT, 
						      e->len_dat,
						      version);
    c->e_byte_array_len.val_codec = cram_encoder_init(e->val_encoding,
						      NULL, E_BYTE_ARRAY, 
						      e->val_dat,
						      version);

    return c;
}